

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::IteratorStepAndValue
               (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
               Var *resultValue)

{
  BOOL BVar1;
  Var in_RAX;
  RecyclableObject *object;
  Var local_38;
  Var value;
  
  local_38 = in_RAX;
  object = IteratorNext(iterator,scriptContext,nextFunc,(Var)0x0);
  GetProperty_InternalSimple(object,object,0x74,&local_38,scriptContext);
  BVar1 = JavascriptConversion::ToBoolean(local_38,scriptContext);
  if (BVar1 == 0) {
    GetProperty_InternalSimple(object,object,0x197,&local_38,scriptContext);
    *resultValue = local_38;
  }
  return BVar1 == 0;
}

Assistant:

bool JavascriptOperators::IteratorStepAndValue(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, Var* resultValue)
    {
        // CONSIDER: Fast-pathing for iterators that are built-ins?
        RecyclableObject* result = JavascriptOperators::IteratorNext(iterator, scriptContext, nextFunc);

        if (!JavascriptOperators::IteratorComplete(result, scriptContext))
        {
            *resultValue = JavascriptOperators::IteratorValue(result, scriptContext);
            return true;
        }

        return false;
    }